

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O2

xcb_void_cookie_t
xcb_input_change_device_key_mapping
          (xcb_connection_t *c,uint8_t device_id,xcb_input_key_code_t first_keycode,
          uint8_t keysyms_per_keycode,uint8_t keycode_count,xcb_keysym_t *keysyms)

{
  uint uVar1;
  undefined7 in_register_00000009;
  undefined3 in_register_00000081;
  long in_FS_OFFSET;
  undefined4 local_70;
  uint8_t local_6c;
  xcb_input_key_code_t local_6b;
  uint8_t local_6a;
  uint8_t local_69;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  xcb_keysym_t *local_28;
  ulong local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = 0xaaaaaaaaaaaaaaaa;
  uStack_50 = 0xaaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaaaaaaaaaa;
  uStack_60 = 0xaaaaaaaaaaaaaaaa;
  local_48 = &local_70;
  local_70 = 0xaaaaaaaa;
  local_40 = 8;
  local_38 = 0;
  uStack_30 = 0;
  local_20 = (ulong)(uint)((int)CONCAT71(in_register_00000009,keysyms_per_keycode) *
                           CONCAT31(in_register_00000081,keycode_count) * 4);
  local_18 = 0;
  uStack_10 = 0;
  local_6c = device_id;
  local_6b = first_keycode;
  local_6a = keysyms_per_keycode;
  local_69 = keycode_count;
  local_28 = keysyms;
  uVar1 = xcb_send_request(c,0,&local_48,&xcb_input_change_device_key_mapping::xcb_req);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (xcb_void_cookie_t)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

xcb_void_cookie_t
xcb_input_change_device_key_mapping (xcb_connection_t     *c,
                                     uint8_t               device_id,
                                     xcb_input_key_code_t  first_keycode,
                                     uint8_t               keysyms_per_keycode,
                                     uint8_t               keycode_count,
                                     const xcb_keysym_t   *keysyms)
{
    static const xcb_protocol_request_t xcb_req = {
        .count = 4,
        .ext = &xcb_input_id,
        .opcode = XCB_INPUT_CHANGE_DEVICE_KEY_MAPPING,
        .isvoid = 1
    };

    struct iovec xcb_parts[6];
    xcb_void_cookie_t xcb_ret;
    xcb_input_change_device_key_mapping_request_t xcb_out;

    xcb_out.device_id = device_id;
    xcb_out.first_keycode = first_keycode;
    xcb_out.keysyms_per_keycode = keysyms_per_keycode;
    xcb_out.keycode_count = keycode_count;

    xcb_parts[2].iov_base = (char *) &xcb_out;
    xcb_parts[2].iov_len = sizeof(xcb_out);
    xcb_parts[3].iov_base = 0;
    xcb_parts[3].iov_len = -xcb_parts[2].iov_len & 3;
    /* xcb_keysym_t keysyms */
    xcb_parts[4].iov_base = (char *) keysyms;
    xcb_parts[4].iov_len = (keycode_count * keysyms_per_keycode) * sizeof(xcb_keysym_t);
    xcb_parts[5].iov_base = 0;
    xcb_parts[5].iov_len = -xcb_parts[4].iov_len & 3;

    xcb_ret.sequence = xcb_send_request(c, 0, xcb_parts + 2, &xcb_req);
    return xcb_ret;
}